

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>,_bool>
* __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
::
insert_unique<std::piecewise_construct_t_const&,std::tuple<S2BooleanOperation::SourceId&&>,std::tuple<>>
          (pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>,_bool>
           *__return_storage_ptr__,
          btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
          *this,key_type *key,piecewise_construct_t *args,
          tuple<S2BooleanOperation::SourceId_&&> *args_1,tuple<> *args_2)

{
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *pbVar1;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *pbVar2;
  ulong uVar3;
  uint i;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *this_00;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *pbVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  iterator iVar9;
  
  if (*(long *)(this + 0x10) == 0) {
    this_00 = btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
              ::new_leaf_root_node
                        ((btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                          *)this,1);
    *(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
      **)(this + 8) = this_00;
    *(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
      **)this = this_00;
  }
  else {
    this_00 = *(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                **)this;
  }
  for (; i = btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
             ::binary_search<S2BooleanOperation::SourceId,std::less<S2BooleanOperation::SourceId>>
                       ((btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
                         *)this_00,key,(less<S2BooleanOperation::SourceId> *)this),
      ((ulong)this_00 & 7) == 0;
      this_00 = btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                ::child(this_00,i)) {
    pbVar4 = this_00;
    uVar5 = i;
    if (this_00[0xb] !=
        (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
         )0x0) goto LAB_001a5cc5;
  }
LAB_001a5d78:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
LAB_001a5cc5:
  if (((ulong)pbVar4 & 7) != 0) goto LAB_001a5d78;
  if (uVar5 != (byte)pbVar4[10]) {
    uVar3 = *(ulong *)(pbVar4 + (long)(int)uVar5 * 0xc + 0xc);
    uVar7 = *(uint *)key & 1;
    uVar8 = (uint)uVar3 & 1;
    if (uVar8 <= uVar7) {
      if (uVar8 < uVar7) {
        bVar6 = false;
        goto LAB_001a5d36;
      }
      uVar7 = *(uint *)key >> 1;
      uVar8 = (uint)(uVar3 >> 1) & 0x7fffffff;
      if ((uVar8 <= uVar7) &&
         ((bVar6 = false, uVar8 < uVar7 || ((int)(uVar3 >> 0x20) <= key->edge_id_))))
      goto LAB_001a5d36;
    }
    goto LAB_001a5d19;
  }
  pbVar2 = *(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
             **)pbVar4;
  if (((ulong)pbVar2 & 7) != 0) goto LAB_001a5d78;
  if ((pbVar2 == (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                  *)0x0) ||
     (pbVar1 = pbVar4 + 8, pbVar4 = pbVar2, uVar5 = (uint)(byte)*pbVar1,
     pbVar2[0xb] !=
     (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
      )0x0)) {
LAB_001a5d19:
    iVar9.position = i;
    iVar9.node = this_00;
    iVar9._12_4_ = 0;
    iVar9 = internal_emplace<std::piecewise_construct_t_const&,std::tuple<S2BooleanOperation::SourceId&&>,std::tuple<>>
                      (this,iVar9,args,args_1,args_2);
    uVar5 = iVar9.position;
    pbVar4 = iVar9.node;
    bVar6 = true;
LAB_001a5d36:
    (__return_storage_ptr__->first).node = pbVar4;
    (__return_storage_ptr__->first).position = uVar5;
    __return_storage_ptr__->second = bVar6;
    return __return_storage_ptr__;
  }
  goto LAB_001a5cc5;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = rightmost_ = new_leaf_root_node(1);
  }

  std::pair<iterator, int> res = internal_locate(key, iterator(root(), 0));
  iterator &iter = res.first;
  if (res.second == kExactMatch) {
    // The key already exists in the tree, do nothing.
    return std::make_pair(internal_last(iter), false);
  } else if (!res.second) {
    iterator last = internal_last(iter);
    if (last.node && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return std::make_pair(last, false);
    }
  }

  return std::make_pair(internal_emplace(iter, std::forward<Args>(args)...),
                        true);
}